

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O2

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE
          (DiagnosticsReporter *this,SyntaxToken *tk,string *diagnosticID,string *category)

{
  allocator<char> local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string s;
  DiagnosticDescriptor local_c0;
  SyntaxToken local_58;
  
  std::operator+(&local_c0.id_,"expected expression of ",category);
  std::operator+(&s,&local_c0.id_," type");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string(local_100,(string *)diagnosticID);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"[[expected expression of type]]",&local_141);
  std::__cxx11::string::string(local_140,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_c0,local_100,local_120,local_140,2,4);
  local_58.field_10 = tk->field_10;
  local_58.tree_ = tk->tree_;
  local_58.syntaxK_ = tk->syntaxK_;
  local_58.byteSize_ = tk->byteSize_;
  local_58.charSize_ = tk->charSize_;
  local_58._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_58.byteOffset_ = tk->byteOffset_;
  local_58.charOffset_ = tk->charOffset_;
  local_58.matchingBracket_ = tk->matchingBracket_;
  local_58.field_7 = tk->field_7;
  local_58._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_58.lineno_ = tk->lineno_;
  local_58.column_ = tk->column_;
  local_58._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_c0,&local_58);
  SyntaxToken::~SyntaxToken(&local_58);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_c0);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE(
        SyntaxToken tk,
        const std::string& diagnosticID,
        const std::string& category)
{
    std::string s = "expected expression of "
            + category
            + " type";
    diagnose(DiagnosticDescriptor(
                 diagnosticID,
                 "[[expected expression of type]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeChecking),
             tk);
}